

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O2

void test_acl_nfs4(void)

{
  wchar_t wVar1;
  archive_entry *entry;
  int *piVar2;
  ulong uVar3;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                   ,L'þ',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81ff);
  set_acls(entry,acls1,4);
  wVar1 = archive_entry_acl_reset(entry,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                      ,L'ą',4,"4",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  compare_acls(entry,acls1,4);
  set_acls(entry,acls2,0x20);
  wVar1 = archive_entry_acl_reset(entry,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                      ,L'ċ',0x20,"32",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  compare_acls(entry,acls2,0x20);
  set_acls(entry,acls1,4);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  wVar1 = archive_entry_acl_reset(entry,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                      ,L'ĕ',4,"4",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  set_acls(entry,acls2,0x20);
  piVar2 = &acls_bad[0].qual;
  for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
    failure("Malformed ACL test #%d",uVar3 & 0xffffffff);
    wVar1 = archive_entry_acl_add_entry
                      (entry,((acl_t *)(piVar2 + -3))->type,piVar2[-2],piVar2[-1],*piVar2,"");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                        ,L'ġ',-0x19,"ARCHIVE_FAILED",(long)wVar1,
                        "archive_entry_acl_add_entry(ae, p->type, p->permset, p->tag, p->qual, p->name)"
                        ,(void *)0x0);
    failure("Malformed ACL test #%d",uVar3 & 0xffffffff);
    wVar1 = archive_entry_acl_reset(entry,L'㰀');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_nfs4.c"
                        ,L'ĥ',0x20,"32",(long)wVar1,
                        "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
    piVar2 = piVar2 + 6;
  }
  archive_entry_free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_acl_nfs4)
{
	struct archive_entry *ae;
	int i;

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Store and read back some basic ACL entries. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	assertEqualInt(4,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));

	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertEqualInt(32,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assertEqualInt(4,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));

	/*
	 * Different types of malformed ACL entries that should
	 * fail when added to existing NFS4 ACLs.
	 */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	for (i = 0; i < (int)(sizeof(acls_bad)/sizeof(acls_bad[0])); ++i) {
		struct acl_t *p = &acls_bad[i];
		failure("Malformed ACL test #%d", i);
		assertEqualInt(ARCHIVE_FAILED,
		    archive_entry_acl_add_entry(ae,
			p->type, p->permset, p->tag, p->qual, p->name));
		failure("Malformed ACL test #%d", i);
		assertEqualInt(32,
		    archive_entry_acl_reset(ae,
			ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	}
	archive_entry_free(ae);
}